

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall luna::Table::SetValue(Table *this,Value *key,Value *value)

{
  bool bVar1;
  pointer ppVar2;
  Value *__x;
  Value *in_RDX;
  long in_RSI;
  long in_RDI;
  iterator it;
  Value *in_stack_ffffffffffffff68;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *in_stack_ffffffffffffff70;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> in_stack_ffffffffffffff78;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *in_stack_ffffffffffffff80;
  Table *in_stack_ffffffffffffff88;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_28;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_20;
  Value *local_18;
  
  local_18 = in_RDX;
  if (((*(int *)(in_RSI + 8) != 2) ||
      (bVar1 = anon_unknown.dwarf_9b466::IsInt(1.01597831367904e-317), !bVar1)) ||
     (bVar1 = SetArrayValue(in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80,
                            (Value *)in_stack_ffffffffffffff78._M_cur), !bVar1)) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                        *)0x1f6110);
    if (!bVar1) {
      bVar1 = Value::IsNil(local_18);
      if (bVar1) {
        return;
      }
      in_stack_ffffffffffffff80 =
           (unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
            *)(in_RDI + 0x20);
      operator_new(0x38);
      std::
      unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
      ::unordered_map((unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                       *)0x1f6151);
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::reset((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
               *)in_stack_ffffffffffffff70,(pointer)in_stack_ffffffffffffff68);
    }
    std::
    unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                  *)0x1f616e);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
         ::find((unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                 *)in_stack_ffffffffffffff68,(key_type *)0x1f617e);
    std::
    unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                  *)0x1f6191);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
         ::end((unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                *)in_stack_ffffffffffffff68);
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (bVar1) {
      bVar1 = Value::IsNil(local_18);
      if (bVar1) {
        std::
        unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
        ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                      *)0x1f61d4);
        std::
        unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
        ::erase(in_stack_ffffffffffffff70,(iterator)in_stack_ffffffffffffff78._M_cur);
      }
      else {
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x1f6209);
        (ppVar2->second).field_0 = local_18->field_0;
        (ppVar2->second).type_ = local_18->type_;
      }
    }
    else {
      bVar1 = Value::IsNil(local_18);
      if (!bVar1) {
        __x = (Value *)std::
                       unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                       ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                                     *)0x1f623c);
        std::make_pair<luna::Value_const&,luna::Value_const&>(__x,in_stack_ffffffffffffff68);
        std::
        unordered_map<luna::Value,luna::Value,std::hash<luna::Value>,std::equal_to<luna::Value>,std::allocator<std::pair<luna::Value_const,luna::Value>>>
        ::insert<std::pair<luna::Value,luna::Value>>
                  (in_stack_ffffffffffffff80,
                   (pair<luna::Value,_luna::Value> *)in_stack_ffffffffffffff78._M_cur);
      }
    }
  }
  return;
}

Assistant:

void Table::SetValue(const Value &key, const Value &value)
    {
        // Try array part
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            if (SetArrayValue(static_cast<std::size_t>(key.num_), value))
                return ;
        }

        // Hash part
        if (!hash_)
        {
            // If value is nil and hash part is not existed, then do nothing
            if (value.IsNil())
                return ;
            hash_.reset(new Hash);
        }

        auto it = hash_->find(key);
        if (it != hash_->end())
        {
            // If value is nil, then just erase the element
            if (value.IsNil())
                hash_->erase(it);
            else
                it->second = value;
        }
        else
        {
            // If key is not existed and value is not nil, then insert it
            if (!value.IsNil())
                hash_->insert(std::make_pair(key, value));
        }
    }